

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_BOLT_OR_BEAM(effect_handler_context_t *context)

{
  wchar_t wVar1;
  wchar_t wVar2;
  uint32_t uVar3;
  wchar_t beam;
  effect_handler_context_t *context_local;
  
  wVar1 = context->beam;
  wVar2 = context->other;
  uVar3 = Rand_div(100);
  if ((int)uVar3 < wVar1 + wVar2) {
    context_local._7_1_ = effect_handler_BEAM(context);
  }
  else {
    context_local._7_1_ = effect_handler_BOLT(context);
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_BOLT_OR_BEAM(effect_handler_context_t *context)
{
	int beam = context->beam + context->other;

	if (randint0(100) < beam)
		return effect_handler_BEAM(context);
	else
		return effect_handler_BOLT(context);
}